

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

void optimize_palette_colors
               (uint16_t *color_cache,int n_cache,int n_colors,int stride,int16_t *centroids,
               int bit_depth)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int j;
  ulong uVar5;
  int iVar6;
  
  if (0 < n_cache) {
    for (lVar3 = 0; lVar3 < n_colors * stride; lVar3 = lVar3 + stride) {
      iVar2 = (int)centroids[lVar3] - (uint)*color_cache;
      iVar1 = -iVar2;
      if (0 < iVar2) {
        iVar1 = iVar2;
      }
      iVar2 = 0;
      for (uVar5 = 1; (uint)n_cache != uVar5; uVar5 = uVar5 + 1) {
        iVar4 = (int)centroids[lVar3] - (uint)color_cache[uVar5];
        iVar6 = -iVar4;
        if (0 < iVar4) {
          iVar6 = iVar4;
        }
        iVar4 = iVar1;
        if (iVar6 < iVar1) {
          iVar4 = iVar6;
        }
        if (iVar6 < iVar1) {
          iVar2 = (int)uVar5;
        }
        iVar1 = iVar4;
      }
      if (iVar1 <= 4 << ((char)bit_depth - 8U & 0x1f)) {
        centroids[lVar3] = color_cache[iVar2];
      }
    }
  }
  return;
}

Assistant:

static inline void optimize_palette_colors(uint16_t *color_cache, int n_cache,
                                           int n_colors, int stride,
                                           int16_t *centroids, int bit_depth) {
  if (n_cache <= 0) return;
  for (int i = 0; i < n_colors * stride; i += stride) {
    int min_diff = abs((int)centroids[i] - (int)color_cache[0]);
    int idx = 0;
    for (int j = 1; j < n_cache; ++j) {
      const int this_diff = abs((int)centroids[i] - (int)color_cache[j]);
      if (this_diff < min_diff) {
        min_diff = this_diff;
        idx = j;
      }
    }
    const int min_threshold = 4 << (bit_depth - 8);
    if (min_diff <= min_threshold) centroids[i] = color_cache[idx];
  }
}